

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O3

void Imath_3_2::jacobiEigenSolver<double>
               (Matrix44<double> *A,Vec4<double> *S,Matrix44<double> *V,double tol)

{
  long lVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int i;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  double *pdVar16;
  int i_1;
  bool bVar17;
  double dVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double local_28 [4];
  
  V->x[0][0] = 1.0;
  V->x[0][1] = 0.0;
  V->x[0][2] = 0.0;
  V->x[0][3] = 0.0;
  V->x[1][0] = 0.0;
  V->x[1][1] = 1.0;
  V->x[1][2] = 0.0;
  V->x[1][3] = 0.0;
  V->x[2][0] = 0.0;
  V->x[2][1] = 0.0;
  V->x[2][2] = 1.0;
  V->x[2][3] = 0.0;
  V->x[3][0] = 0.0;
  V->x[3][1] = 0.0;
  V->x[3][2] = 0.0;
  V->x[3][3] = 1.0;
  lVar14 = 0;
  pdVar16 = (double *)A;
  do {
    (&S->x)[lVar14] = *pdVar16;
    lVar14 = lVar14 + 1;
    pdVar16 = pdVar16 + 5;
  } while (lVar14 != 4);
  dVar18 = 0.0;
  uVar15 = 0;
  pdVar16 = (double *)A;
  do {
    if (uVar15 < 3) {
      lVar14 = 1;
      uVar19 = SUB84(dVar18,0);
      uVar20 = (undefined4)((ulong)dVar18 >> 0x20);
      do {
        dVar18 = ABS(pdVar16[lVar14]);
        if (dVar18 <= (double)CONCAT44(uVar20,uVar19)) {
          dVar18 = (double)CONCAT44(uVar20,uVar19);
        }
        lVar1 = uVar15 + lVar14;
        lVar14 = lVar14 + 1;
        uVar19 = SUB84(dVar18,0);
        uVar20 = (undefined4)((ulong)dVar18 >> 0x20);
      } while (lVar1 != 3);
    }
    uVar15 = uVar15 + 1;
    pdVar16 = pdVar16 + 5;
  } while (uVar15 != 4);
  dVar18 = dVar18 * tol;
  if ((dVar18 != 0.0) || (NAN(dVar18))) {
    uVar13 = 0;
    do {
      local_28[2] = 0.0;
      local_28[3] = 0.0;
      local_28[0] = 0.0;
      local_28[1] = 0.0;
      dVar26 = A->x[0][0];
      dVar24 = A->x[0][1];
      dVar2 = A->x[1][1];
      dVar25 = dVar2 - dVar26;
      if (ABS(dVar24 + dVar24) <= ABS(dVar25) * tol) {
        A->x[0][1] = 0.0;
        local_28[1] = 0.0;
        local_28[0] = 0.0;
      }
      else {
        dVar25 = dVar25 / (dVar24 + dVar24);
        dVar21 = *(double *)(&DAT_0014a100 + (ulong)(dVar25 < 0.0) * 8) /
                 (SQRT(dVar25 * dVar25 + 1.0) + ABS(dVar25));
        dVar25 = 1.0 / SQRT(dVar21 * dVar21 + 1.0);
        dVar24 = dVar24 * dVar21;
        dVar21 = dVar21 * dVar25;
        dVar22 = dVar21 / (dVar25 + 1.0);
        local_28[0] = 0.0 - dVar24;
        local_28[1] = dVar24 + 0.0;
        A->x[0][0] = dVar26 - dVar24;
        A->x[1][1] = dVar2 + dVar24;
        A->x[0][1] = 0.0;
        dVar26 = A->x[0][2];
        dVar25 = A->x[0][3];
        dVar27 = A->x[1][2];
        dVar24 = A->x[1][3];
        dVar2 = dVar25 - (dVar22 * dVar25 + dVar24) * dVar21;
        auVar11._8_4_ = SUB84(dVar2,0);
        auVar11._0_8_ = dVar26 - (dVar22 * dVar26 + dVar27) * dVar21;
        auVar11._12_4_ = (int)((ulong)dVar2 >> 0x20);
        *(undefined1 (*) [16])(A->x[0] + 2) = auVar11;
        dVar24 = (dVar25 - dVar22 * dVar24) * dVar21 + dVar24;
        auVar3._8_4_ = SUB84(dVar24,0);
        auVar3._0_8_ = (dVar26 - dVar22 * dVar27) * dVar21 + dVar27;
        auVar3._12_4_ = (int)((ulong)dVar24 >> 0x20);
        *(undefined1 (*) [16])(A->x[1] + 2) = auVar3;
        lVar14 = 0;
        do {
          dVar24 = *(double *)((long)V->x[0] + lVar14);
          dVar2 = *(double *)((long)V->x[1] + lVar14);
          dVar26 = *(double *)((long)V->x[0] + lVar14 + 8);
          dVar25 = *(double *)((long)V->x[1] + lVar14 + 8);
          dVar27 = (-dVar22 * dVar26 + dVar24) * dVar21 + dVar26;
          auVar4._8_4_ = SUB84(dVar27,0);
          auVar4._0_8_ = (dVar22 * dVar24 + dVar26) * -dVar21 + dVar24;
          auVar4._12_4_ = (int)((ulong)dVar27 >> 0x20);
          *(undefined1 (*) [16])((long)V->x[0] + lVar14) = auVar4;
          pdVar16 = (double *)((long)V->x[1] + lVar14);
          *pdVar16 = (dVar22 * dVar2 + dVar25) * -dVar21 + dVar2;
          pdVar16[1] = (-dVar22 * dVar25 + dVar2) * dVar21 + dVar25;
          lVar14 = lVar14 + 0x40;
        } while (lVar14 != 0x80);
        dVar26 = A->x[0][0];
      }
      dVar24 = A->x[0][2];
      dVar2 = A->x[2][2];
      dVar25 = dVar2 - dVar26;
      if (ABS(dVar24 + dVar24) <= ABS(dVar25) * tol) {
        A->x[0][2] = 0.0;
        local_28[2] = 0.0;
      }
      else {
        dVar25 = dVar25 / (dVar24 + dVar24);
        dVar27 = *(double *)(&DAT_0014a100 + (ulong)(dVar25 < 0.0) * 8) /
                 (SQRT(dVar25 * dVar25 + 1.0) + ABS(dVar25));
        dVar25 = 1.0 / SQRT(dVar27 * dVar27 + 1.0);
        dVar24 = dVar24 * dVar27;
        dVar27 = dVar27 * dVar25;
        dVar25 = dVar27 / (dVar25 + 1.0);
        local_28[0] = local_28[0] - dVar24;
        local_28[2] = dVar24 + 0.0;
        A->x[0][0] = dVar26 - dVar24;
        A->x[2][2] = dVar2 + dVar24;
        A->x[0][2] = 0.0;
        dVar24 = A->x[1][2];
        dVar2 = A->x[0][1];
        dVar26 = A->x[0][3];
        A->x[0][1] = dVar2 - (dVar25 * dVar2 + dVar24) * dVar27;
        A->x[1][2] = (dVar2 - dVar25 * dVar24) * dVar27 + dVar24;
        dVar24 = A->x[2][3];
        A->x[0][3] = dVar26 - (dVar25 * dVar26 + dVar24) * dVar27;
        A->x[2][3] = (dVar26 - dVar25 * dVar24) * dVar27 + dVar24;
        lVar14 = 0;
        do {
          dVar24 = *(double *)((long)V->x[0] + lVar14);
          dVar2 = *(double *)((long)V->x[0] + lVar14 + 0x10);
          dVar26 = *(double *)((long)V->x[1] + lVar14);
          dVar21 = *(double *)((long)V->x[1] + lVar14 + 0x10);
          *(double *)((long)V->x[0] + lVar14) = (dVar25 * dVar24 + dVar2) * -dVar27 + dVar24;
          *(double *)((long)V->x[1] + lVar14) = (dVar25 * dVar26 + dVar21) * -dVar27 + dVar26;
          *(double *)((long)V->x[0] + lVar14 + 0x10) = (-dVar25 * dVar2 + dVar24) * dVar27 + dVar2;
          *(double *)((long)V->x[1] + lVar14 + 0x10) = (-dVar25 * dVar21 + dVar26) * dVar27 + dVar21
          ;
          lVar14 = lVar14 + 0x40;
        } while (lVar14 != 0x80);
        dVar26 = A->x[0][0];
      }
      dVar24 = A->x[0][3];
      dVar2 = A->x[3][3];
      dVar25 = dVar2 - dVar26;
      if (ABS(dVar24 + dVar24) <= ABS(dVar25) * tol) {
        A->x[0][3] = 0.0;
        local_28[3] = 0.0;
      }
      else {
        dVar25 = dVar25 / (dVar24 + dVar24);
        dVar21 = *(double *)(&DAT_0014a100 + (ulong)(dVar25 < 0.0) * 8) /
                 (SQRT(dVar25 * dVar25 + 1.0) + ABS(dVar25));
        dVar25 = 1.0 / SQRT(dVar21 * dVar21 + 1.0);
        dVar24 = dVar24 * dVar21;
        dVar21 = dVar21 * dVar25;
        dVar22 = dVar21 / (dVar25 + 1.0);
        local_28[0] = local_28[0] - dVar24;
        local_28[3] = dVar24 + 0.0;
        A->x[0][0] = dVar26 - dVar24;
        A->x[3][3] = dVar2 + dVar24;
        A->x[0][3] = 0.0;
        dVar24 = A->x[1][3];
        dVar2 = A->x[2][3];
        dVar25 = A->x[0][1];
        dVar27 = A->x[0][2];
        A->x[1][3] = (dVar25 - dVar22 * dVar24) * dVar21 + dVar24;
        dVar26 = dVar27 - (dVar22 * dVar27 + dVar2) * dVar21;
        auVar5._8_4_ = SUB84(dVar26,0);
        auVar5._0_8_ = dVar25 - (dVar22 * dVar25 + dVar24) * dVar21;
        auVar5._12_4_ = (int)((ulong)dVar26 >> 0x20);
        *(undefined1 (*) [16])(A->x[0] + 1) = auVar5;
        A->x[2][3] = (dVar27 - dVar22 * dVar2) * dVar21 + dVar2;
        lVar14 = 0;
        do {
          dVar24 = *(double *)((long)V->x[0] + lVar14);
          dVar2 = *(double *)((long)V->x[0] + lVar14 + 0x18);
          dVar26 = *(double *)((long)V->x[1] + lVar14);
          dVar25 = *(double *)((long)V->x[1] + lVar14 + 0x18);
          dVar27 = (dVar22 * dVar26 + dVar25) * -dVar21 + dVar26;
          *(double *)((long)V->x[0] + lVar14) = (dVar22 * dVar24 + dVar2) * -dVar21 + dVar24;
          auVar12._8_4_ = SUB84(dVar27,0);
          auVar12._0_8_ = (-dVar22 * dVar2 + dVar24) * dVar21 + dVar2;
          auVar12._12_4_ = (int)((ulong)dVar27 >> 0x20);
          *(undefined1 (*) [16])((long)V->x[0] + lVar14 + 0x18) = auVar12;
          *(double *)((long)V->x[1] + lVar14 + 0x18) = (-dVar22 * dVar25 + dVar26) * dVar21 + dVar25
          ;
          lVar14 = lVar14 + 0x40;
        } while (lVar14 != 0x80);
      }
      dVar26 = A->x[1][1];
      dVar24 = A->x[1][2];
      dVar2 = A->x[2][2];
      dVar25 = dVar2 - dVar26;
      if (ABS(dVar24 + dVar24) <= ABS(dVar25) * tol) {
        A->x[1][2] = 0.0;
      }
      else {
        dVar25 = dVar25 / (dVar24 + dVar24);
        dVar21 = *(double *)(&DAT_0014a100 + (ulong)(dVar25 < 0.0) * 8) /
                 (SQRT(dVar25 * dVar25 + 1.0) + ABS(dVar25));
        dVar25 = 1.0 / SQRT(dVar21 * dVar21 + 1.0);
        dVar24 = dVar24 * dVar21;
        dVar21 = dVar21 * dVar25;
        dVar22 = dVar21 / (dVar25 + 1.0);
        local_28[1] = local_28[1] - dVar24;
        local_28[2] = local_28[2] + dVar24;
        A->x[1][1] = dVar26 - dVar24;
        A->x[2][2] = dVar2 + dVar24;
        A->x[1][2] = 0.0;
        dVar26 = -dVar21;
        dVar25 = -dVar22;
        dVar2 = A->x[0][1];
        dVar27 = A->x[0][2];
        dVar24 = dVar21 * (dVar25 * dVar27 + dVar2) + dVar27;
        auVar8._8_4_ = SUB84(dVar24,0);
        auVar8._0_8_ = dVar26 * (dVar22 * dVar2 + dVar27) + dVar2;
        auVar8._12_4_ = (int)((ulong)dVar24 >> 0x20);
        *(undefined1 (*) [16])(A->x[0] + 1) = auVar8;
        dVar24 = A->x[1][3];
        dVar2 = A->x[2][3];
        A->x[1][3] = dVar24 - (dVar22 * dVar24 + dVar2) * dVar21;
        A->x[2][3] = (dVar24 - dVar22 * dVar2) * dVar21 + dVar2;
        lVar14 = 0;
        do {
          dVar24 = *(double *)((long)V->x[0] + lVar14 + 8);
          dVar2 = *(double *)((long)V->x[1] + lVar14 + 8);
          dVar27 = *(double *)((long)V->x[0] + lVar14 + 0x10);
          dVar23 = *(double *)((long)V->x[1] + lVar14 + 0x10);
          auVar9._8_4_ = SUB84(dVar22,0);
          auVar9._0_8_ = dVar25;
          auVar9._12_4_ = (int)((ulong)dVar25 >> 0x20);
          dVar28 = (dVar25 * dVar27 + dVar24) * dVar21 + dVar27;
          auVar6._8_4_ = SUB84(dVar28,0);
          auVar6._0_8_ = (dVar22 * dVar24 + dVar27) * dVar26 + dVar24;
          auVar6._12_4_ = (int)((ulong)dVar28 >> 0x20);
          *(undefined1 (*) [16])((long)V->x[0] + lVar14 + 8) = auVar6;
          pdVar16 = (double *)((long)V->x[1] + lVar14 + 8);
          *pdVar16 = (dVar22 * dVar2 + dVar23) * dVar26 + dVar2;
          pdVar16[1] = (auVar9._8_8_ * dVar23 + dVar2) * dVar21 + dVar23;
          lVar14 = lVar14 + 0x40;
        } while (lVar14 != 0x80);
        dVar26 = A->x[1][1];
      }
      dVar24 = A->x[1][3];
      dVar2 = A->x[3][3];
      if (ABS(dVar24 + dVar24) <= ABS(dVar2 - dVar26) * tol) {
        A->x[1][3] = 0.0;
      }
      else {
        dVar25 = (dVar2 - dVar26) / (dVar24 + dVar24);
        dVar27 = *(double *)(&DAT_0014a100 + (ulong)(dVar25 < 0.0) * 8) /
                 (SQRT(dVar25 * dVar25 + 1.0) + ABS(dVar25));
        dVar25 = 1.0 / SQRT(dVar27 * dVar27 + 1.0);
        dVar24 = dVar24 * dVar27;
        dVar27 = dVar27 * dVar25;
        dVar25 = dVar27 / (dVar25 + 1.0);
        local_28[1] = local_28[1] - dVar24;
        local_28[3] = local_28[3] + dVar24;
        A->x[1][1] = dVar26 - dVar24;
        A->x[3][3] = dVar2 + dVar24;
        A->x[1][3] = 0.0;
        dVar24 = A->x[0][1];
        dVar2 = A->x[0][3];
        A->x[0][1] = dVar24 - (dVar25 * dVar24 + dVar2) * dVar27;
        A->x[0][3] = (dVar24 - dVar25 * dVar2) * dVar27 + dVar2;
        dVar24 = A->x[1][2];
        dVar2 = A->x[2][3];
        A->x[1][2] = dVar24 - (dVar25 * dVar24 + dVar2) * dVar27;
        A->x[2][3] = (dVar24 - dVar25 * dVar2) * dVar27 + dVar2;
        lVar14 = 0;
        do {
          dVar24 = *(double *)((long)V->x[0] + lVar14 + 8);
          dVar2 = *(double *)((long)V->x[0] + lVar14 + 0x18);
          dVar26 = *(double *)((long)V->x[1] + lVar14 + 8);
          dVar21 = *(double *)((long)V->x[1] + lVar14 + 0x18);
          *(double *)((long)V->x[0] + lVar14 + 8) = (dVar25 * dVar24 + dVar2) * -dVar27 + dVar24;
          *(double *)((long)V->x[1] + lVar14 + 8) = (dVar25 * dVar26 + dVar21) * -dVar27 + dVar26;
          *(double *)((long)V->x[0] + lVar14 + 0x18) = (-dVar25 * dVar2 + dVar24) * dVar27 + dVar2;
          *(double *)((long)V->x[1] + lVar14 + 0x18) = (-dVar25 * dVar21 + dVar26) * dVar27 + dVar21
          ;
          lVar14 = lVar14 + 0x40;
        } while (lVar14 != 0x80);
        dVar2 = A->x[3][3];
      }
      dVar24 = A->x[2][2];
      dVar26 = A->x[2][3];
      dVar25 = dVar2 - dVar24;
      if (ABS(dVar26 + dVar26) <= ABS(dVar25) * tol) {
        A->x[2][3] = 0.0;
      }
      else {
        dVar25 = dVar25 / (dVar26 + dVar26);
        dVar22 = *(double *)(&DAT_0014a100 + (ulong)(dVar25 < 0.0) * 8) /
                 (SQRT(dVar25 * dVar25 + 1.0) + ABS(dVar25));
        dVar25 = 1.0 / SQRT(dVar22 * dVar22 + 1.0);
        dVar26 = dVar26 * dVar22;
        dVar22 = dVar22 * dVar25;
        dVar23 = dVar22 / (dVar25 + 1.0);
        local_28[2] = local_28[2] - dVar26;
        local_28[3] = local_28[3] + dVar26;
        A->x[2][2] = dVar24 - dVar26;
        A->x[3][3] = dVar2 + dVar26;
        A->x[2][3] = 0.0;
        dVar2 = -dVar22;
        dVar24 = -dVar23;
        dVar26 = A->x[0][2];
        dVar25 = A->x[0][3];
        dVar27 = A->x[1][2];
        dVar21 = A->x[1][3];
        A->x[0][2] = (dVar23 * dVar26 + dVar25) * dVar2 + dVar26;
        A->x[0][3] = (dVar24 * dVar25 + dVar26) * dVar22 + dVar25;
        A->x[1][2] = (dVar23 * dVar27 + dVar21) * dVar2 + dVar27;
        A->x[1][3] = (dVar24 * dVar21 + dVar27) * dVar22 + dVar21;
        lVar14 = 0;
        do {
          dVar26 = *(double *)((long)V->x[0] + lVar14 + 0x10);
          dVar25 = *(double *)((long)V->x[1] + lVar14 + 0x10);
          dVar27 = *(double *)((long)V->x[0] + lVar14 + 0x18);
          dVar21 = *(double *)((long)V->x[1] + lVar14 + 0x18);
          auVar10._8_4_ = SUB84(dVar23,0);
          auVar10._0_8_ = dVar24;
          auVar10._12_4_ = (int)((ulong)dVar24 >> 0x20);
          dVar28 = (dVar24 * dVar27 + dVar26) * dVar22 + dVar27;
          auVar7._8_4_ = SUB84(dVar28,0);
          auVar7._0_8_ = (dVar23 * dVar26 + dVar27) * dVar2 + dVar26;
          auVar7._12_4_ = (int)((ulong)dVar28 >> 0x20);
          *(undefined1 (*) [16])((long)V->x[0] + lVar14 + 0x10) = auVar7;
          pdVar16 = (double *)((long)V->x[1] + lVar14 + 0x10);
          *pdVar16 = (dVar23 * dVar25 + dVar21) * dVar2 + dVar25;
          pdVar16[1] = (auVar10._8_8_ * dVar21 + dVar25) * dVar22 + dVar21;
          lVar14 = lVar14 + 0x40;
        } while (lVar14 != 0x80);
      }
      lVar14 = 0;
      pdVar16 = (double *)A;
      do {
        dVar24 = local_28[lVar14] + (&S->x)[lVar14];
        (&S->x)[lVar14] = dVar24;
        *pdVar16 = dVar24;
        lVar14 = lVar14 + 1;
        pdVar16 = pdVar16 + 5;
      } while (lVar14 != 4);
      dVar24 = 0.0;
      uVar15 = 0;
      pdVar16 = (double *)A;
      do {
        if (uVar15 < 3) {
          lVar14 = 1;
          dVar2 = dVar24;
          do {
            dVar24 = ABS(pdVar16[lVar14]);
            if (ABS(pdVar16[lVar14]) <= dVar2) {
              dVar24 = dVar2;
            }
            lVar1 = uVar15 + lVar14;
            lVar14 = lVar14 + 1;
            dVar2 = dVar24;
          } while (lVar1 != 3);
        }
        uVar15 = uVar15 + 1;
        pdVar16 = pdVar16 + 5;
      } while (uVar15 != 4);
    } while ((dVar18 < dVar24) && (bVar17 = uVar13 < 0x13, uVar13 = uVar13 + 1, bVar17));
  }
  return;
}

Assistant:

void
jacobiEigenSolver (Matrix44<T>& A, Vec4<T>& S, Matrix44<T>& V, const T tol)
{
    V.makeIdentity ();

    for (int i = 0; i < 4; ++i)
    {
        S[i] = A[i][i];
    }

    const int maxIter =
        20; // In case we get really unlucky, prevents infinite loops
    const T absTol =
        tol * maxOffDiagSymm (A); // Tolerance is in terms of the maximum
    if (absTol != 0)              // _off-diagonal_ entry.
    {
        int numIter = 0;
        do
        {
            ++numIter;
            Vec4<T> Z (0, 0, 0, 0);
            bool    changed = jacobiRotation<0, 1, 2, 3> (A, V, Z, tol);
            changed = jacobiRotation<0, 2, 1, 3> (A, V, Z, tol) || changed;
            changed = jacobiRotation<0, 3, 1, 2> (A, V, Z, tol) || changed;
            changed = jacobiRotation<1, 2, 0, 3> (A, V, Z, tol) || changed;
            changed = jacobiRotation<1, 3, 0, 2> (A, V, Z, tol) || changed;
            changed = jacobiRotation<2, 3, 0, 1> (A, V, Z, tol) || changed;
            for (int i = 0; i < 4; ++i)
            {
                A[i][i] = S[i] += Z[i];
            }
            if (!changed) break;
        } while (maxOffDiagSymm (A) > absTol && numIter < maxIter);
    }
}